

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::ByteSizeLong
          (CustomLayerParams_CustomLayerParamValue *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 *puVar7;
  
  uVar1 = this->_oneof_case_[0];
  sVar5 = 0;
  if ((int)uVar1 < 0x1e) {
    if (uVar1 == 10) {
      sVar5 = 9;
    }
    else if (uVar1 == 0x14) {
      if (uVar1 != 0x14) {
        puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      }
      else {
        puVar7 = (undefined8 *)(this->value_).longvalue_;
      }
      uVar4 = (uint)puVar7[1] | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = puVar7[1] + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  else if (uVar1 == 0x1e) {
    if ((this->value_).intvalue_ < 0) {
      sVar5 = 0xc;
    }
    else {
      uVar4 = (this->value_).intvalue_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = (size_t)((iVar2 * 9 + 0x49U >> 6) + 2);
    }
  }
  else if (uVar1 == 0x28) {
    uVar6 = (this->value_).longvalue_ | 1;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar5 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 2;
  }
  else if (uVar1 == 0x32) {
    sVar5 = 3;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

inline CustomLayerParams_CustomLayerParamValue::ValueCase CustomLayerParams_CustomLayerParamValue::value_case() const {
  return CustomLayerParams_CustomLayerParamValue::ValueCase(_oneof_case_[0]);
}